

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

string * __thiscall
miniros::console::Formatter::getTokenStrings_abi_cxx11_
          (Formatter *this,void *logger_handle,Level level,char *str,char *file,char *function,
          int line)

{
  bool bVar1;
  element_type *peVar2;
  uint in_ECX;
  undefined8 in_RDX;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
  *in_stack_00000008;
  undefined4 in_stack_00000010;
  const_iterator it;
  stringstream ss;
  vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
  *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  string local_1e8 [32];
  shared_ptr<miniros::console::Token> *local_1c8;
  __normal_iterator<const_std::shared_ptr<miniros::console::Token>_*,_std::vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>_>
  local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  undefined8 local_30;
  undefined8 local_28;
  uint local_1c;
  undefined8 local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1c0._M_current =
       (shared_ptr<miniros::console::Token> *)
       std::
       vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
       ::begin(in_stack_fffffffffffffdd8);
  while( true ) {
    local_1c8 = (shared_ptr<miniros::console::Token> *)
                std::
                vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                ::end(in_stack_fffffffffffffdd8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<miniros::console::Token>_*,_std::vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       (__normal_iterator<const_std::shared_ptr<miniros::console::Token>_*,_std::vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<miniros::console::Token>_*,_std::vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>_>
    ::operator*(&local_1c0);
    peVar2 = std::
             __shared_ptr_access<miniros::console::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::console::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e39b6);
    in_stack_fffffffffffffdd8 = in_stack_00000008;
    in_stack_fffffffffffffde0 = in_stack_00000010;
    (*peVar2->_vptr_Token[2])(local_1e8,peVar2,local_18,(ulong)local_1c,local_28,local_30);
    std::operator<<(local_1a8,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<miniros::console::Token>_*,_std::vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>_>
    ::operator++(&local_1c0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return in_RDI;
}

Assistant:

std::string Formatter::getTokenStrings(void *logger_handle, Level level,
    const char *str, const char *file,
    const char *function, int line) const
{
  std::stringstream ss;

  for (V_Token::const_iterator it = tokens_.begin(); it != tokens_.end(); ++it)
  {
    ss << (*it)->getString(logger_handle, level, str, file, function, line);
  }

  return ss.str();
}